

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading_atomic_ref_count.h
# Opt level: O0

uintmax_t threading_atomic_ref_count_load(threading_atomic_ref_count ref)

{
  threading_atomic_ref_count ref_local;
  
  return ref->count;
}

Assistant:

static inline uintmax_t threading_atomic_ref_count_load(threading_atomic_ref_count ref)
{
#if defined(__THREAD_SANITIZER__)
	uintmax_t result = 0;

	threading_mutex_store(&ref->m, &result, &ref->count, sizeof(uintmax_t));

	return result;
#else
	return atomic_load_explicit(&ref->count, memory_order_relaxed);
#endif
}